

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

bool __thiscall APlayerPawn::ResetAirSupply(APlayerPawn *this,bool playgasp)

{
  double dVar1;
  int iVar2;
  int iVar3;
  player_t *ppVar4;
  int iVar5;
  FSoundID local_24;
  
  iVar3 = level.time;
  iVar2 = ((this->super_AActor).player)->air_finished;
  if (iVar2 < level.time && playgasp) {
    S_FindSound("*gasp");
    S_Sound(&this->super_AActor,2,&local_24,1.0,1.0);
  }
  if (0 < level.airsupply) {
    ppVar4 = (this->super_AActor).player;
    dVar1 = ppVar4->mo->AirCapacity;
    if (0.0 < dVar1) {
      iVar5 = (int)(dVar1 * (double)level.airsupply) + level.time;
      goto LAB_00558a3d;
    }
  }
  ppVar4 = (this->super_AActor).player;
  iVar5 = 0x7fffffff;
LAB_00558a3d:
  ppVar4->air_finished = iVar5;
  return iVar2 < iVar3;
}

Assistant:

bool APlayerPawn::ResetAirSupply (bool playgasp)
{
	bool wasdrowning = (player->air_finished < level.time);

	if (playgasp && wasdrowning)
	{
		S_Sound (this, CHAN_VOICE, "*gasp", 1, ATTN_NORM);
	}
	if (level.airsupply> 0 && player->mo->AirCapacity > 0) player->air_finished = level.time + int(level.airsupply * player->mo->AirCapacity);
	else player->air_finished = INT_MAX;
	return wasdrowning;
}